

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O3

void trico_compress(uint32_t *nr_of_compressed_bytes,uint8_t **out,float *input,
                   uint32_t number_of_floats,uint32_t hash1_size_exponent,
                   uint32_t hash2_size_exponent)

{
  float fVar1;
  byte bVar2;
  undefined4 *puVar3;
  void *pvVar4;
  void *pvVar5;
  uint32_t k;
  uint uVar6;
  uint8_t *puVar7;
  float *pfVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  float fVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  uint8_t *puVar16;
  ulong uVar17;
  uint8_t uVar18;
  ulong uVar19;
  uint uVar20;
  float fVar21;
  uint uVar22;
  uint8_t **ppuVar23;
  bool bVar24;
  int iVar26;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  int iVar29;
  undefined1 auVar28 [16];
  uint32_t bcode [8];
  uint32_t xor1 [8];
  uint32_t xor2 [8];
  uint local_f8 [8];
  undefined4 uStack_d8;
  undefined1 auStack_d4 [36];
  float *local_b0;
  int local_a8;
  int local_a4;
  uint8_t **local_a0;
  ulong local_98;
  void *local_90;
  void *local_88;
  ulong local_80;
  undefined4 local_78;
  uint *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  uVar6 = hash1_size_exponent & 0xfffffffe;
  if (0x1d < (hash1_size_exponent & 0xfffffffe)) {
    uVar6 = 0x1e;
  }
  uVar13 = hash2_size_exponent & 0xfffffffe;
  if (0x1d < (hash2_size_exponent & 0xfffffffe)) {
    uVar13 = 0x1e;
  }
  local_b0 = input;
  local_58 = nr_of_compressed_bytes;
  puVar7 = (uint8_t *)
           malloc((ulong)((number_of_floats & 7) + number_of_floats * 4 +
                         (number_of_floats * 3 + 0x15 >> 3)));
  *out = puVar7;
  uVar22 = 1 << ((byte)uVar6 & 0x1f);
  uVar20 = 1 << ((byte)uVar13 & 0x1f);
  local_a0 = out;
  local_88 = calloc((ulong)uVar22,4);
  local_90 = calloc((ulong)uVar20,4);
  local_40 = (ulong)(uVar13 >> 1);
  *puVar7 = (char)(uVar13 >> 1) + (byte)uVar6 * '\b';
  puVar7[1] = (uint8_t)(number_of_floats >> 0x18);
  puVar7[2] = (uint8_t)(number_of_floats >> 0x10);
  puVar7[3] = (uint8_t)(number_of_floats >> 8);
  puVar7[4] = (uint8_t)number_of_floats;
  puVar7 = puVar7 + 5;
  local_38 = (ulong)number_of_floats;
  if (number_of_floats == 0) {
    uVar17 = 0;
  }
  else {
    local_50 = (ulong)(uVar22 - 1);
    local_48 = (ulong)(uVar20 - 1);
    local_a8 = 0x20 - uVar6;
    local_a4 = 0x20 - uVar13;
    uVar14 = 0;
    iVar26 = 0;
    fVar12 = 0.0;
    uVar19 = 0;
    uVar10 = 0;
    local_98 = (ulong)uVar6;
    pfVar8 = local_b0;
    fVar21 = 0.0;
    do {
      pvVar5 = local_88;
      pvVar4 = local_90;
      local_80 = uVar14;
      uVar20 = (uint)uVar14 & 7;
      uVar17 = (ulong)uVar20;
      local_b0 = pfVar8;
      fVar1 = *pfVar8;
      bVar2 = (byte)local_98;
      uVar6 = (uint)fVar1 ^ (uint)fVar12;
      *(float *)((long)local_88 + uVar10 * 4) = fVar1;
      bVar11 = (byte)local_a8;
      *(int *)((long)local_90 + uVar19 * 4) = (int)fVar1 - (int)fVar21;
      uVar14 = (ulong)(uVar20 * 4);
      *(uint *)((long)&uStack_d8 + uVar14) = uVar6;
      uVar10 = (ulong)(((uint)fVar1 >> (bVar11 & 0x1f) ^ (int)uVar10 << (bVar2 & 0x1f)) &
                      (uint)local_50);
      uVar22 = iVar26 + (int)fVar21 ^ (uint)fVar1;
      *(uint *)((long)&local_78 + uVar14) = uVar22;
      uVar19 = (ulong)(((uint)((int)fVar1 - (int)fVar21) >> ((byte)local_a4 & 0x1f) ^
                       (int)uVar19 << ((byte)local_40 & 0x1f)) & (uint)local_48);
      iVar26 = *(int *)((long)pvVar4 + uVar19 * 4);
      *(undefined4 *)((long)local_f8 + uVar14) = 4;
      uVar13 = 0;
      bVar24 = fVar1 == fVar12;
      fVar12 = *(float *)((long)pvVar5 + uVar10 * 4);
      if ((bVar24) || (uVar13 = 1, uVar6 < 0x100)) {
LAB_001110ef:
        local_f8[uVar17] = uVar13;
      }
      else {
        if (uVar6 < 0x10000) {
          uVar13 = (uint)(uVar22 < 0x100) * 3 + 2;
          goto LAB_001110ef;
        }
        if (uVar6 < 0x1000000) {
          local_f8[uVar17] = 3;
          uVar13 = 5;
          if ((uVar22 < 0x100) || (uVar13 = 6, uVar22 < 0x10000)) goto LAB_001110ef;
        }
        else {
          uVar13 = 5;
          if (((uVar22 < 0x100) || (uVar13 = 6, uVar22 < 0x10000)) ||
             (uVar13 = 7, uVar22 < 0x1000000)) goto LAB_001110ef;
        }
      }
      if (uVar20 == 7) {
        uVar6 = local_f8[1] << 3 | local_f8[2] << 6 | local_f8[3] << 9 |
                local_f8[4] << 0xc | local_f8[5] << 0xf | local_f8[6] << 0x12 | local_f8[7] << 0x15
                | local_f8[0];
        *puVar7 = (uint8_t)(uVar6 >> 0x10);
        puVar7[1] = (uint8_t)(uVar6 >> 8);
        puVar7[2] = (uint8_t)uVar6;
        puVar7 = puVar7 + 3;
        lVar15 = 0;
        lVar9 = 0;
        do {
          switch(*(undefined4 *)((long)local_f8 + lVar15)) {
          case 1:
            puVar16 = (uint8_t *)(&uStack_d8 + lVar9);
            break;
          case 2:
            puVar3 = &uStack_d8;
            uVar18 = *(uint8_t *)((long)&uStack_d8 + lVar15 + 1);
            goto LAB_001111fb;
          case 3:
            puVar16 = (uint8_t *)(&uStack_d8 + lVar9);
            *puVar7 = *(uint8_t *)((long)&uStack_d8 + lVar15 + 2);
            uVar18 = *(uint8_t *)((long)&uStack_d8 + lVar15 + 1);
            goto LAB_0011121b;
          case 4:
            puVar16 = (uint8_t *)(&uStack_d8 + lVar9);
            *puVar7 = *(uint8_t *)((long)&uStack_d8 + lVar15 + 3);
            puVar7[1] = *(uint8_t *)((long)&uStack_d8 + lVar15 + 2);
            puVar7[2] = *(uint8_t *)((long)&uStack_d8 + lVar15 + 1);
            puVar7 = puVar7 + 3;
            break;
          case 5:
            puVar16 = (uint8_t *)(&local_78 + lVar9);
            break;
          case 6:
            puVar3 = &local_78;
            uVar18 = *(uint8_t *)((long)&local_78 + lVar15 + 1);
LAB_001111fb:
            puVar16 = (uint8_t *)(puVar3 + lVar9);
            *puVar7 = uVar18;
            puVar7 = puVar7 + 1;
            break;
          case 7:
            puVar16 = (uint8_t *)((long)&local_78 + lVar15);
            *puVar7 = *(uint8_t *)((long)&local_78 + lVar15 + 2);
            uVar18 = *(uint8_t *)((long)&local_78 + lVar15 + 1);
LAB_0011121b:
            puVar7[1] = uVar18;
            puVar7 = puVar7 + 2;
            break;
          default:
            goto switchD_00111178_default;
          }
          *puVar7 = *puVar16;
          puVar7 = puVar7 + 1;
switchD_00111178_default:
          lVar9 = lVar9 + 1;
          lVar15 = lVar15 + 4;
        } while (lVar15 != 0x20);
      }
      pfVar8 = local_b0 + 1;
      uVar6 = (int)local_80 + 1;
      uVar14 = (ulong)uVar6;
      fVar21 = fVar1;
    } while (uVar6 != (uint)local_38);
    ppuVar23 = local_a0;
    if (uVar20 == 7) goto LAB_0011155d;
  }
  ppuVar23 = local_a0;
  uVar19 = 0;
  uVar6 = (uint)uVar17;
  uVar14 = (ulong)(uVar6 * 4);
  uVar10 = (ulong)(6 - uVar6);
  if (6 < uVar6) {
    uVar10 = uVar19;
  }
  memset(auStack_d4 + uVar14,0,(ulong)((int)uVar10 * 4 + 4));
  uVar10 = 6 - uVar17;
  if (6 < uVar17) {
    uVar10 = uVar19;
  }
  auVar25._8_4_ = (int)uVar10;
  auVar25._0_8_ = uVar10;
  auVar25._12_4_ = (int)(uVar10 >> 0x20);
  auVar25 = auVar25 ^ _DAT_0011b8f0;
  do {
    auVar27._8_4_ = (int)uVar19;
    auVar27._0_8_ = uVar19;
    auVar27._12_4_ = (int)(uVar19 >> 0x20);
    auVar28 = (auVar27 | _DAT_0011b8e0) ^ _DAT_0011b8f0;
    iVar26 = auVar25._4_4_;
    if ((bool)(~(auVar28._4_4_ == iVar26 && auVar25._0_4_ < auVar28._0_4_ || iVar26 < auVar28._4_4_)
              & 1)) {
      *(undefined4 *)((long)local_f8 + uVar19 * 4 + uVar14 + 4) = 1;
    }
    if ((auVar28._12_4_ != auVar25._12_4_ || auVar28._8_4_ <= auVar25._8_4_) &&
        auVar28._12_4_ <= auVar25._12_4_) {
      *(undefined4 *)((long)local_f8 + uVar19 * 4 + uVar14 + 8) = 1;
    }
    auVar27 = (auVar27 | _DAT_0011b8d0) ^ _DAT_0011b8f0;
    iVar29 = auVar27._4_4_;
    if (iVar29 <= iVar26 && (iVar29 != iVar26 || auVar27._0_4_ <= auVar25._0_4_)) {
      *(undefined4 *)((long)local_f8 + uVar19 * 4 + uVar14 + 0xc) = 1;
      *(undefined4 *)((long)local_f8 + uVar19 * 4 + uVar14 + 0x10) = 1;
    }
    uVar19 = uVar19 + 4;
  } while (((int)uVar10 + 4U & 0xc) != uVar19);
  local_f8[0] = local_f8[1] << 3 | local_f8[2] << 6 | local_f8[3] << 9 |
                local_f8[4] << 0xc | local_f8[5] << 0xf | local_f8[6] << 0x12 | local_f8[7] << 0x15
                | local_f8[0];
  *puVar7 = (uint8_t)(local_f8[0] >> 0x10);
  puVar7[1] = (uint8_t)(local_f8[0] >> 8);
  puVar7[2] = (uint8_t)local_f8[0];
  puVar7 = puVar7 + 3;
  lVar9 = 0;
  lVar15 = 0;
  do {
    switch(*(undefined4 *)((long)local_f8 + lVar9)) {
    case 1:
      puVar16 = (uint8_t *)(&uStack_d8 + lVar15);
      break;
    case 2:
      puVar3 = &uStack_d8;
      uVar18 = *(uint8_t *)((long)&uStack_d8 + lVar9 + 1);
      goto LAB_0011151a;
    case 3:
      puVar16 = (uint8_t *)(&uStack_d8 + lVar15);
      *puVar7 = *(uint8_t *)((long)&uStack_d8 + lVar9 + 2);
      uVar18 = *(uint8_t *)((long)&uStack_d8 + lVar9 + 1);
      goto LAB_0011153a;
    case 4:
      puVar16 = (uint8_t *)(&uStack_d8 + lVar15);
      *puVar7 = *(uint8_t *)((long)&uStack_d8 + lVar9 + 3);
      puVar7[1] = *(uint8_t *)((long)&uStack_d8 + lVar9 + 2);
      puVar7[2] = *(uint8_t *)((long)&uStack_d8 + lVar9 + 1);
      puVar7 = puVar7 + 3;
      break;
    case 5:
      puVar16 = (uint8_t *)(&local_78 + lVar15);
      break;
    case 6:
      puVar3 = &local_78;
      uVar18 = *(uint8_t *)((long)&local_78 + lVar9 + 1);
LAB_0011151a:
      puVar16 = (uint8_t *)(puVar3 + lVar15);
      *puVar7 = uVar18;
      puVar7 = puVar7 + 1;
      break;
    case 7:
      puVar16 = (uint8_t *)((long)&local_78 + lVar9);
      *puVar7 = *(uint8_t *)((long)&local_78 + lVar9 + 2);
      uVar18 = *(uint8_t *)((long)&local_78 + lVar9 + 1);
LAB_0011153a:
      puVar7[1] = uVar18;
      puVar7 = puVar7 + 2;
      break;
    default:
      goto switchD_00111498_default;
    }
    *puVar7 = *puVar16;
    puVar7 = puVar7 + 1;
switchD_00111498_default:
    lVar15 = lVar15 + 1;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x20);
LAB_0011155d:
  puVar16 = *ppuVar23;
  uVar6 = (int)puVar7 - (int)puVar16;
  *local_58 = uVar6;
  free(local_88);
  free(local_90);
  puVar7 = (uint8_t *)realloc(puVar16,(ulong)uVar6);
  *ppuVar23 = puVar7;
  return;
}

Assistant:

void trico_compress(uint32_t* nr_of_compressed_bytes, uint8_t** out, const float* input, const uint32_t number_of_floats, uint32_t hash1_size_exponent, uint32_t hash2_size_exponent)
  {
  hash1_size_exponent = (hash1_size_exponent >> 1) << 1;
  hash2_size_exponent = (hash2_size_exponent >> 1) << 1;
  if (hash1_size_exponent > 30)
    hash1_size_exponent = 30;
  if (hash2_size_exponent > 30)
    hash2_size_exponent = 30;

  uint32_t max_size = (number_of_floats) * sizeof(float) + 3 * (number_of_floats + 7) / 8 + (number_of_floats & 7); // theoretical maximum
  *out = (uint8_t*)trico_malloc(max_size);


  const uint32_t hash1_size = 1 << hash1_size_exponent;
  const uint32_t hash2_size = 1 << hash2_size_exponent;
  const uint32_t hash1_mask = hash1_size - 1;
  const uint32_t hash2_mask = hash2_size - 1;

  uint32_t* hash_table_1 = (uint32_t*)trico_calloc(hash1_size, 4);
  uint32_t* hash_table_2 = (uint32_t*)trico_calloc(hash2_size, 4);

  uint32_t value;
  uint32_t stride;
  uint32_t last_value = 0;
  uint32_t hash1 = 0;
  uint32_t hash2 = 0;
  uint32_t prediction1 = 0;
  uint32_t prediction2 = 0;
  uint32_t xor1[8];
  uint32_t xor2[8];
  uint32_t bcode[8];
  uint32_t j = 0;
  uint8_t* p_out = *out;

  uint8_t hash_info = (uint8_t)(((hash1_size_exponent >> 1) << 4) | (hash2_size_exponent >> 1));
  *p_out++ = hash_info;

  *p_out++ = (uint8_t)((number_of_floats >> 24));
  *p_out++ = (uint8_t)((number_of_floats >> 16) & 0xff);
  *p_out++ = (uint8_t)((number_of_floats >> 8) & 0xff);
  *p_out++ = (uint8_t)((number_of_floats) & 0xff);

  for (uint32_t i = 0; i < number_of_floats; ++i)
    {
    j = i & 7;
    value = *(const uint32_t*)(input++);

    xor1[j] = value ^ prediction1;
    hash_table_1[hash1] = value;
    hash1 = trico_compute_hash1_32(hash1, value, hash1_size_exponent, hash1_mask);
    prediction1 = hash_table_1[hash1];

    stride = value - last_value;
    xor2[j] = value ^ (last_value + prediction2);
    last_value = value;
    hash_table_2[hash2] = stride;
    hash2 = trico_compute_hash2_32(hash2, stride, hash2_size_exponent, hash2_mask);
    prediction2 = hash_table_2[hash2];


    bcode[j] = 4; // 4 bytes
    if (0 == xor1[j])
      {
      bcode[j] = 0; // 0 bytes
      }
    else if (0 == (xor1[j] >> 8))
      {
      bcode[j] = 1; // 1 byte
      }
    else if (0 == (xor1[j] >> 16))
      {
      bcode[j] = 2; // 2 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 5; // 1 byte
        }
      }
    else if (0 == (xor1[j] >> 24))
      {
      bcode[j] = 3; // 3 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 5; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 6; // 2 bytes
        }
      }
    else // 4 bytes
      {
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 5; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 6; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 7; // 3 bytes
        }
      }

    if (j == 7)
      {
      trico_fill_code(&p_out, xor1, xor2, bcode);
      }
    }
  for (uint32_t l = j + 1; l < 8; ++l)
    {
    bcode[l] = 1;
    xor1[l] = 0;
    }
  if (j != 7)
    {
    trico_fill_code(&p_out, xor1, xor2, bcode);
    }

  *nr_of_compressed_bytes = (uint32_t)(p_out - *out);
  trico_free(hash_table_1);
  trico_free(hash_table_2);
  *out = (uint8_t*)trico_realloc(*out, *nr_of_compressed_bytes);
  }